

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_sound_thumbnail.cxx
# Opt level: O2

void __thiscall xray_re::xr_sound_thumbnail::load(xr_sound_thumbnail *this,xr_reader *r)

{
  float *pfVar1;
  uint32_t *puVar2;
  uint __line;
  undefined8 in_RAX;
  size_t sVar3;
  char *__assertion;
  uint16_t version;
  undefined8 uStack_18;
  uint32_t type;
  
  uStack_18 = in_RAX;
  sVar3 = xr_reader::r_chunk<unsigned_short>(r,0x810,&version);
  if (sVar3 == 0) {
    __assertion = "0";
    __line = 0x10;
  }
  else if (version == 0x14) {
    sVar3 = xr_reader::r_chunk<unsigned_int>(r,0x813,&type);
    if (sVar3 == 0) {
      __assertion = "0";
      __line = 0x15;
    }
    else if (type == 2) {
      sVar3 = xr_reader::find_chunk(r,0x1000);
      if (sVar3 != 0) {
        pfVar1 = (float *)(r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
        this->quality = *pfVar1;
        pfVar1 = (float *)(r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
        this->min_dist = *pfVar1;
        pfVar1 = (float *)(r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
        this->max_dist = *pfVar1;
        puVar2 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
        this->game_type = *puVar2;
        sVar3 = xr_reader::find_chunk(r,0x1001);
        if (sVar3 != 0) {
          pfVar1 = (float *)(r->field_2).m_p_u32;
          (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
          this->base_volume = *pfVar1;
        }
        sVar3 = xr_reader::find_chunk(r,0x1002);
        if (sVar3 != 0) {
          pfVar1 = (float *)(r->field_2).m_p_u32;
          (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
          this->max_ai_dist = *pfVar1;
        }
        return;
      }
      __assertion = "0";
      __line = 0x19;
    }
    else {
      __assertion = "type == THM_TYPE_SOUND";
      __line = 0x16;
    }
  }
  else {
    __assertion = "version == THM_VERSION_SOUNDPARAM";
    __line = 0x11;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_sound_thumbnail.cxx"
                ,__line,"void xray_re::xr_sound_thumbnail::load(xr_reader &)");
}

Assistant:

void xr_sound_thumbnail::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk(THM_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == THM_VERSION_SOUNDPARAM);

	uint32_t type;
	if (!r.r_chunk(THM_CHUNK_TYPE, type))
		xr_not_expected();
	xr_assert(type == THM_TYPE_SOUND);

	if (!r.find_chunk(THM_CHUNK_SOUNDPARAM))
		xr_not_expected();
	quality = r.r_float();
	min_dist = r.r_float();
	max_dist = r.r_float();
	game_type = r.r_u32();
	r.debug_find_chunk();

	if (r.find_chunk(THM_CHUNK_SOUNDPARAM_VOLUME)) {
		base_volume = r.r_float();
		r.debug_find_chunk();
	}
	if (r.find_chunk(THM_CHUNK_SOUNDPARAM_AI)) {
		max_ai_dist = r.r_float();
		r.debug_find_chunk();
	}
}